

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  Ref<embree::Geometry> *pRVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 (*pauVar62) [16];
  uint uVar63;
  undefined1 (*pauVar64) [16];
  long lVar65;
  long lVar66;
  int iVar67;
  long lVar68;
  uint uVar69;
  ulong uVar70;
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  long lVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  AABBNodeMB4D *node1;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar94 [16];
  float fVar106;
  undefined1 auVar99 [32];
  undefined1 auVar95 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar104;
  float fVar105;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  float fVar118;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [32];
  undefined1 auVar127 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar146;
  undefined1 auVar145 [64];
  float fVar153;
  undefined1 auVar148 [16];
  float fVar147;
  undefined1 auVar149 [32];
  float fVar151;
  float fVar152;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [64];
  float fVar157;
  undefined1 auVar158 [32];
  float fVar160;
  float fVar161;
  uint uVar162;
  float fVar163;
  float fVar164;
  uint uVar165;
  float fVar166;
  uint uVar167;
  float fVar168;
  uint uVar169;
  float fVar170;
  uint uVar171;
  uint uVar172;
  undefined1 auVar159 [64];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar180 [32];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar191 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar192 [64];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_15e0 [32];
  float local_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  RTCFilterFunctionNArguments local_14d0;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [8];
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  undefined4 uStack_1464;
  undefined1 local_1460 [32];
  undefined1 local_1430 [16];
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float local_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [8];
  float fStack_13b8;
  float fStack_13b4;
  undefined1 local_13b0 [8];
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [8];
  float fStack_1398;
  float fStack_1394;
  undefined1 local_1390 [8];
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [8];
  float fStack_1378;
  float fStack_1374;
  undefined1 local_1370 [8];
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [8];
  float fStack_1358;
  float fStack_1354;
  undefined1 local_1350 [8];
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [8];
  float fStack_1338;
  float fStack_1334;
  undefined1 local_1330 [16];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar64 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13d0._4_4_ = uVar3;
  local_13d0._0_4_ = uVar3;
  local_13d0._8_4_ = uVar3;
  local_13d0._12_4_ = uVar3;
  auVar145 = ZEXT1664(local_13d0);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13e0._4_4_ = uVar3;
  local_13e0._0_4_ = uVar3;
  local_13e0._8_4_ = uVar3;
  local_13e0._12_4_ = uVar3;
  auVar150 = ZEXT1664(local_13e0);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_13f0._4_4_ = uVar3;
  local_13f0._0_4_ = uVar3;
  local_13f0._8_4_ = uVar3;
  local_13f0._12_4_ = uVar3;
  auVar159 = ZEXT1664(local_13f0);
  fStack_13f4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_1404 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_1414 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar85 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar91 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar67 = (tray->tnear).field_0.i[k];
  local_1430._4_4_ = iVar67;
  local_1430._0_4_ = iVar67;
  local_1430._8_4_ = iVar67;
  local_1430._12_4_ = iVar67;
  auVar192 = ZEXT1664(local_1430);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  uVar71 = 1 << ((byte)k & 0x1f);
  iVar67 = (tray->tfar).field_0.i[k];
  auVar103 = ZEXT1664(CONCAT412(iVar67,CONCAT48(iVar67,CONCAT44(iVar67,iVar67))));
  auVar128._8_4_ = 0x3f800000;
  auVar128._0_8_ = 0x3f8000003f800000;
  auVar128._12_4_ = 0x3f800000;
  auVar128._16_4_ = 0x3f800000;
  auVar128._20_4_ = 0x3f800000;
  auVar128._24_4_ = 0x3f800000;
  auVar128._28_4_ = 0x3f800000;
  auVar112._8_4_ = 0xbf800000;
  auVar112._0_8_ = 0xbf800000bf800000;
  auVar112._12_4_ = 0xbf800000;
  auVar112._16_4_ = 0xbf800000;
  auVar112._20_4_ = 0xbf800000;
  auVar112._24_4_ = 0xbf800000;
  auVar112._28_4_ = 0xbf800000;
  _local_1120 = vblendvps_avx(auVar128,auVar112,local_1100);
  fStack_13f8 = fStack_13f4;
  fStack_13fc = fStack_13f4;
  local_1400 = fStack_13f4;
  fStack_1408 = fStack_1404;
  fStack_140c = fStack_1404;
  local_1410 = fStack_1404;
  fStack_1418 = fStack_1414;
  fStack_141c = fStack_1414;
  local_1420 = fStack_1414;
  fVar186 = fStack_1414;
  fVar184 = fStack_1414;
  fVar146 = fStack_1414;
  fVar163 = fStack_1414;
  fVar118 = fStack_1404;
  fVar109 = fStack_1404;
  fVar108 = fStack_1404;
  fVar107 = fStack_1404;
  fVar106 = fStack_13f4;
  fVar105 = fStack_13f4;
  fVar104 = fStack_13f4;
  fVar92 = fStack_13f4;
LAB_003a99f5:
  do {
    pauVar62 = pauVar64 + -1;
    pauVar64 = pauVar64 + -1;
    if (*(float *)(*pauVar62 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar70 = *(ulong *)*pauVar64;
      while ((uVar70 & 8) == 0) {
        uVar89 = uVar70 & 0xfffffffffffffff0;
        fVar4 = *(float *)(ray + k * 4 + 0xe0);
        auVar148._4_4_ = fVar4;
        auVar148._0_4_ = fVar4;
        auVar148._8_4_ = fVar4;
        auVar148._12_4_ = fVar4;
        pfVar2 = (float *)(uVar89 + 0x80 + uVar73);
        pfVar1 = (float *)(uVar89 + 0x20 + uVar73);
        auVar95._0_4_ = fVar4 * *pfVar2 + *pfVar1;
        auVar95._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
        auVar95._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
        auVar95._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
        auVar95 = vsubps_avx(auVar95,auVar145._0_16_);
        auVar110._0_4_ = fVar92 * auVar95._0_4_;
        auVar110._4_4_ = fVar104 * auVar95._4_4_;
        auVar110._8_4_ = fVar105 * auVar95._8_4_;
        auVar110._12_4_ = fVar106 * auVar95._12_4_;
        pfVar2 = (float *)(uVar89 + 0x80 + uVar85);
        auVar95 = vmaxps_avx(auVar192._0_16_,auVar110);
        pfVar1 = (float *)(uVar89 + 0x20 + uVar85);
        auVar94._0_4_ = fVar4 * *pfVar2 + *pfVar1;
        auVar94._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
        auVar94._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
        auVar94._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
        auVar110 = vsubps_avx(auVar94,auVar150._0_16_);
        pfVar2 = (float *)(uVar89 + 0x80 + uVar91);
        pfVar1 = (float *)(uVar89 + 0x20 + uVar91);
        auVar130._0_4_ = fVar4 * *pfVar2 + *pfVar1;
        auVar130._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
        auVar130._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
        auVar130._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
        auVar125._0_4_ = fVar107 * auVar110._0_4_;
        auVar125._4_4_ = fVar108 * auVar110._4_4_;
        auVar125._8_4_ = fVar109 * auVar110._8_4_;
        auVar125._12_4_ = fVar118 * auVar110._12_4_;
        auVar110 = vsubps_avx(auVar130,auVar159._0_16_);
        auVar131._0_4_ = fVar163 * auVar110._0_4_;
        auVar131._4_4_ = fVar146 * auVar110._4_4_;
        auVar131._8_4_ = fVar184 * auVar110._8_4_;
        auVar131._12_4_ = fVar186 * auVar110._12_4_;
        auVar110 = vmaxps_avx(auVar125,auVar131);
        pfVar2 = (float *)(uVar89 + 0x80 + (uVar73 ^ 0x10));
        pfVar1 = (float *)(uVar89 + 0x20 + (uVar73 ^ 0x10));
        auVar132._0_4_ = fVar4 * *pfVar2 + *pfVar1;
        auVar132._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
        auVar132._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
        auVar132._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
        auVar95 = vmaxps_avx(auVar95,auVar110);
        auVar110 = vsubps_avx(auVar132,auVar145._0_16_);
        pfVar2 = (float *)(uVar89 + 0x80 + (uVar85 ^ 0x10));
        auVar126._0_4_ = fVar92 * auVar110._0_4_;
        auVar126._4_4_ = fVar104 * auVar110._4_4_;
        auVar126._8_4_ = fVar105 * auVar110._8_4_;
        auVar126._12_4_ = fVar106 * auVar110._12_4_;
        pfVar1 = (float *)(uVar89 + 0x20 + (uVar85 ^ 0x10));
        auVar133._0_4_ = fVar4 * *pfVar2 + *pfVar1;
        auVar133._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
        auVar133._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
        auVar133._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
        auVar110 = vsubps_avx(auVar133,auVar150._0_16_);
        pfVar2 = (float *)(uVar89 + 0x80 + (uVar91 ^ 0x10));
        pfVar1 = (float *)(uVar89 + 0x20 + (uVar91 ^ 0x10));
        auVar136._0_4_ = fVar4 * *pfVar2 + *pfVar1;
        auVar136._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
        auVar136._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
        auVar136._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
        auVar134._0_4_ = fVar107 * auVar110._0_4_;
        auVar134._4_4_ = fVar108 * auVar110._4_4_;
        auVar134._8_4_ = fVar109 * auVar110._8_4_;
        auVar134._12_4_ = fVar118 * auVar110._12_4_;
        auVar110 = vsubps_avx(auVar136,auVar159._0_16_);
        auVar137._0_4_ = fVar163 * auVar110._0_4_;
        auVar137._4_4_ = fVar146 * auVar110._4_4_;
        auVar137._8_4_ = fVar184 * auVar110._8_4_;
        auVar137._12_4_ = fVar186 * auVar110._12_4_;
        auVar110 = vminps_avx(auVar134,auVar137);
        auVar94 = vminps_avx(auVar103._0_16_,auVar126);
        auVar110 = vminps_avx(auVar94,auVar110);
        if (((uint)uVar70 & 7) == 6) {
          auVar94 = vcmpps_avx(auVar95,auVar110,2);
          auVar110 = vcmpps_avx(*(undefined1 (*) [16])(uVar89 + 0xe0),auVar148,2);
          auVar148 = vcmpps_avx(auVar148,*(undefined1 (*) [16])(uVar89 + 0xf0),1);
          auVar110 = vandps_avx(auVar110,auVar148);
          auVar110 = vandps_avx(auVar110,auVar94);
        }
        else {
          auVar110 = vcmpps_avx(auVar95,auVar110,2);
        }
        auVar110 = vpslld_avx(auVar110,0x1f);
        uVar69 = vmovmskps_avx(auVar110);
        local_1300._0_16_ = auVar95;
        if (uVar69 == 0) {
          if (pauVar64 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_003a99f5;
        }
        uVar69 = uVar69 & 0xff;
        lVar66 = 0;
        if (uVar69 != 0) {
          for (; (uVar69 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
          }
        }
        uVar70 = *(ulong *)(uVar89 + lVar66 * 8);
        uVar69 = uVar69 - 1 & uVar69;
        if (uVar69 != 0) {
          uVar63 = *(uint *)(local_1300 + lVar66 * 4);
          lVar66 = 0;
          if (uVar69 != 0) {
            for (; (uVar69 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
            }
          }
          uVar72 = *(ulong *)(uVar89 + lVar66 * 8);
          uVar162 = *(uint *)(local_1300 + lVar66 * 4);
          uVar69 = uVar69 - 1 & uVar69;
          if (uVar69 == 0) {
            if (uVar63 < uVar162) {
              *(ulong *)*pauVar64 = uVar72;
              *(uint *)(*pauVar64 + 8) = uVar162;
              pauVar64 = pauVar64 + 1;
            }
            else {
              *(ulong *)*pauVar64 = uVar70;
              *(uint *)(*pauVar64 + 8) = uVar63;
              pauVar64 = pauVar64 + 1;
              uVar70 = uVar72;
            }
          }
          else {
            auVar111._8_8_ = 0;
            auVar111._0_8_ = uVar70;
            auVar95 = vpunpcklqdq_avx(auVar111,ZEXT416(uVar63));
            auVar119._8_8_ = 0;
            auVar119._0_8_ = uVar72;
            auVar110 = vpunpcklqdq_avx(auVar119,ZEXT416(uVar162));
            lVar66 = 0;
            if (uVar69 != 0) {
              for (; (uVar69 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
              }
            }
            auVar127._8_8_ = 0;
            auVar127._0_8_ = *(ulong *)(uVar89 + lVar66 * 8);
            auVar148 = vpunpcklqdq_avx(auVar127,ZEXT416(*(uint *)(local_1300 + lVar66 * 4)));
            auVar94 = vpcmpgtd_avx(auVar110,auVar95);
            uVar69 = uVar69 - 1 & uVar69;
            if (uVar69 == 0) {
              auVar125 = vpshufd_avx(auVar94,0xaa);
              auVar94 = vblendvps_avx(auVar110,auVar95,auVar125);
              auVar95 = vblendvps_avx(auVar95,auVar110,auVar125);
              auVar110 = vpcmpgtd_avx(auVar148,auVar94);
              auVar125 = vpshufd_avx(auVar110,0xaa);
              auVar110 = vblendvps_avx(auVar148,auVar94,auVar125);
              auVar94 = vblendvps_avx(auVar94,auVar148,auVar125);
              auVar148 = vpcmpgtd_avx(auVar94,auVar95);
              auVar125 = vpshufd_avx(auVar148,0xaa);
              auVar148 = vblendvps_avx(auVar94,auVar95,auVar125);
              auVar95 = vblendvps_avx(auVar95,auVar94,auVar125);
              *pauVar64 = auVar95;
              pauVar64[1] = auVar148;
              uVar70 = auVar110._0_8_;
              pauVar64 = pauVar64 + 2;
            }
            else {
              lVar66 = 0;
              if (uVar69 != 0) {
                for (; (uVar69 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                }
              }
              auVar138._8_8_ = 0;
              auVar138._0_8_ = *(ulong *)(uVar89 + lVar66 * 8);
              auVar126 = vpunpcklqdq_avx(auVar138,ZEXT416(*(uint *)(local_1300 + lVar66 * 4)));
              auVar125 = vpshufd_avx(auVar94,0xaa);
              auVar94 = vblendvps_avx(auVar110,auVar95,auVar125);
              auVar95 = vblendvps_avx(auVar95,auVar110,auVar125);
              auVar110 = vpcmpgtd_avx(auVar126,auVar148);
              auVar125 = vpshufd_avx(auVar110,0xaa);
              auVar110 = vblendvps_avx(auVar126,auVar148,auVar125);
              auVar148 = vblendvps_avx(auVar148,auVar126,auVar125);
              auVar125 = vpcmpgtd_avx(auVar148,auVar95);
              auVar126 = vpshufd_avx(auVar125,0xaa);
              auVar125 = vblendvps_avx(auVar148,auVar95,auVar126);
              auVar95 = vblendvps_avx(auVar95,auVar148,auVar126);
              auVar148 = vpcmpgtd_avx(auVar110,auVar94);
              auVar126 = vpshufd_avx(auVar148,0xaa);
              auVar148 = vblendvps_avx(auVar110,auVar94,auVar126);
              auVar110 = vblendvps_avx(auVar94,auVar110,auVar126);
              auVar94 = vpcmpgtd_avx(auVar125,auVar110);
              auVar126 = vpshufd_avx(auVar94,0xaa);
              auVar94 = vblendvps_avx(auVar125,auVar110,auVar126);
              auVar110 = vblendvps_avx(auVar110,auVar125,auVar126);
              *pauVar64 = auVar95;
              pauVar64[1] = auVar110;
              pauVar64[2] = auVar94;
              uVar70 = auVar148._0_8_;
              pauVar64 = pauVar64 + 3;
            }
          }
        }
      }
      uVar89 = (ulong)((uint)uVar70 & 0xf);
      if (uVar89 != 8) {
        uVar70 = uVar70 & 0xfffffffffffffff0;
        lVar66 = 0;
        do {
          lVar65 = lVar66 * 0x60;
          pSVar6 = context->scene;
          pRVar7 = (pSVar6->geometries).items;
          pGVar8 = pRVar7[*(uint *)(uVar70 + 0x40 + lVar65)].ptr;
          fVar92 = (pGVar8->time_range).lower;
          fVar92 = pGVar8->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0xe0) - fVar92) /
                   ((pGVar8->time_range).upper - fVar92));
          auVar95 = vroundss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92),9);
          auVar95 = vminss_avx(auVar95,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
          auVar137 = vmaxss_avx(ZEXT816(0) << 0x20,auVar95);
          iVar67 = (int)auVar137._0_4_;
          lVar82 = (long)iVar67 * 0x38;
          lVar9 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar82);
          uVar81 = (ulong)*(uint *)(uVar70 + 4 + lVar65);
          auVar95 = *(undefined1 (*) [16])(lVar9 + (ulong)*(uint *)(uVar70 + lVar65) * 4);
          uVar74 = (ulong)*(uint *)(uVar70 + 0x10 + lVar65);
          auVar110 = *(undefined1 (*) [16])(lVar9 + uVar74 * 4);
          uVar75 = (ulong)*(uint *)(uVar70 + 0x20 + lVar65);
          auVar94 = *(undefined1 (*) [16])(lVar9 + uVar75 * 4);
          uVar76 = (ulong)*(uint *)(uVar70 + 0x30 + lVar65);
          auVar148 = *(undefined1 (*) [16])(lVar9 + uVar76 * 4);
          lVar9 = *(long *)&pRVar7[*(uint *)(uVar70 + 0x44 + lVar65)].ptr[2].numPrimitives;
          lVar10 = *(long *)(lVar9 + lVar82);
          auVar125 = *(undefined1 (*) [16])(lVar10 + uVar81 * 4);
          uVar77 = (ulong)*(uint *)(uVar70 + 0x14 + lVar65);
          auVar126 = *(undefined1 (*) [16])(lVar10 + uVar77 * 4);
          uVar78 = (ulong)*(uint *)(uVar70 + 0x24 + lVar65);
          auVar130 = *(undefined1 (*) [16])(lVar10 + uVar78 * 4);
          uVar79 = (ulong)*(uint *)(uVar70 + 0x34 + lVar65);
          auVar131 = *(undefined1 (*) [16])(lVar10 + uVar79 * 4);
          lVar10 = *(long *)&pRVar7[*(uint *)(uVar70 + 0x48 + lVar65)].ptr[2].numPrimitives;
          lVar11 = *(long *)(lVar10 + lVar82);
          uVar80 = (ulong)*(uint *)(uVar70 + 8 + lVar65);
          auVar132 = *(undefined1 (*) [16])(lVar11 + uVar80 * 4);
          uVar86 = (ulong)*(uint *)(uVar70 + 0x18 + lVar65);
          auVar133 = *(undefined1 (*) [16])(lVar11 + uVar86 * 4);
          uVar87 = (ulong)*(uint *)(uVar70 + 0x28 + lVar65);
          auVar134 = *(undefined1 (*) [16])(lVar11 + uVar87 * 4);
          uVar88 = (ulong)*(uint *)(uVar70 + 0x38 + lVar65);
          auVar136 = *(undefined1 (*) [16])(lVar11 + uVar88 * 4);
          fVar92 = fVar92 - auVar137._0_4_;
          local_1330 = ZEXT416((uint)fVar92);
          lVar11 = *(long *)&pRVar7[*(uint *)(uVar70 + 0x4c + lVar65)].ptr[2].numPrimitives;
          lVar82 = *(long *)(lVar11 + lVar82);
          uVar72 = (ulong)*(uint *)(uVar70 + 0xc + lVar65);
          auVar137 = *(undefined1 (*) [16])(lVar82 + uVar72 * 4);
          uVar83 = (ulong)*(uint *)(uVar70 + 0x1c + lVar65);
          auVar111 = *(undefined1 (*) [16])(lVar82 + uVar83 * 4);
          auVar119 = vunpcklps_avx(auVar95,auVar132);
          auVar132 = vunpckhps_avx(auVar95,auVar132);
          auVar127 = vunpcklps_avx(auVar125,auVar137);
          auVar125 = vunpckhps_avx(auVar125,auVar137);
          uVar90 = (ulong)*(uint *)(uVar70 + 0x2c + lVar65);
          auVar95 = *(undefined1 (*) [16])(lVar82 + uVar90 * 4);
          _local_1350 = vunpcklps_avx(auVar132,auVar125);
          _local_1390 = vunpcklps_avx(auVar119,auVar127);
          _local_1370 = vunpckhps_avx(auVar119,auVar127);
          auVar132 = vunpcklps_avx(auVar110,auVar133);
          auVar125 = vunpckhps_avx(auVar110,auVar133);
          auVar133 = vunpcklps_avx(auVar126,auVar111);
          auVar126 = vunpckhps_avx(auVar126,auVar111);
          uVar84 = (ulong)*(uint *)(uVar70 + 0x3c + lVar65);
          auVar110 = *(undefined1 (*) [16])(lVar82 + uVar84 * 4);
          _local_1340 = vunpcklps_avx(auVar125,auVar126);
          _local_1380 = vunpcklps_avx(auVar132,auVar133);
          _local_1360 = vunpckhps_avx(auVar132,auVar133);
          auVar126 = vunpcklps_avx(auVar94,auVar134);
          auVar94 = vunpckhps_avx(auVar94,auVar134);
          auVar132 = vunpcklps_avx(auVar130,auVar95);
          auVar125 = vunpckhps_avx(auVar130,auVar95);
          lVar68 = (long)(iVar67 + 1) * 0x38;
          lVar82 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar68);
          auVar95 = *(undefined1 (*) [16])(lVar82 + (ulong)*(uint *)(uVar70 + lVar65) * 4);
          auVar130 = vunpcklps_avx(auVar94,auVar125);
          _local_13c0 = vunpcklps_avx(auVar126,auVar132);
          _local_13b0 = vunpckhps_avx(auVar126,auVar132);
          auVar125 = vunpcklps_avx(auVar148,auVar136);
          auVar94 = vunpckhps_avx(auVar148,auVar136);
          auVar126 = vunpcklps_avx(auVar131,auVar110);
          auVar148 = vunpckhps_avx(auVar131,auVar110);
          lVar10 = *(long *)(lVar10 + lVar68);
          auVar110 = *(undefined1 (*) [16])(lVar10 + uVar80 * 4);
          auVar131 = vunpcklps_avx(auVar94,auVar148);
          auVar132 = vunpcklps_avx(auVar125,auVar126);
          _local_13a0 = vunpckhps_avx(auVar125,auVar126);
          lVar9 = *(long *)(lVar9 + lVar68);
          auVar148 = vunpcklps_avx(auVar95,auVar110);
          auVar94 = vunpckhps_avx(auVar95,auVar110);
          auVar95 = *(undefined1 (*) [16])(lVar9 + uVar81 * 4);
          lVar11 = *(long *)(lVar11 + lVar68);
          auVar110 = *(undefined1 (*) [16])(lVar11 + uVar72 * 4);
          auVar125 = vunpcklps_avx(auVar95,auVar110);
          auVar95 = vunpckhps_avx(auVar95,auVar110);
          auVar133 = vunpcklps_avx(auVar94,auVar95);
          auVar134 = vunpcklps_avx(auVar148,auVar125);
          auVar94 = vunpckhps_avx(auVar148,auVar125);
          auVar95 = *(undefined1 (*) [16])(lVar82 + uVar74 * 4);
          auVar110 = *(undefined1 (*) [16])(lVar10 + uVar86 * 4);
          auVar125 = vunpcklps_avx(auVar95,auVar110);
          auVar148 = vunpckhps_avx(auVar95,auVar110);
          auVar95 = *(undefined1 (*) [16])(lVar9 + uVar77 * 4);
          auVar110 = *(undefined1 (*) [16])(lVar11 + uVar83 * 4);
          auVar126 = vunpcklps_avx(auVar95,auVar110);
          auVar95 = vunpckhps_avx(auVar95,auVar110);
          auVar136 = vunpcklps_avx(auVar148,auVar95);
          auVar137 = vunpcklps_avx(auVar125,auVar126);
          auVar148 = vunpckhps_avx(auVar125,auVar126);
          auVar95 = *(undefined1 (*) [16])(lVar82 + uVar75 * 4);
          auVar110 = *(undefined1 (*) [16])(lVar10 + uVar87 * 4);
          auVar126 = vunpcklps_avx(auVar95,auVar110);
          auVar125 = vunpckhps_avx(auVar95,auVar110);
          auVar95 = *(undefined1 (*) [16])(lVar9 + uVar78 * 4);
          auVar110 = *(undefined1 (*) [16])(lVar11 + uVar90 * 4);
          auVar111 = vunpcklps_avx(auVar95,auVar110);
          auVar95 = vunpckhps_avx(auVar95,auVar110);
          auVar119 = vunpcklps_avx(auVar125,auVar95);
          auVar127 = vunpcklps_avx(auVar126,auVar111);
          auVar125 = vunpckhps_avx(auVar126,auVar111);
          auVar95 = *(undefined1 (*) [16])(lVar82 + uVar76 * 4);
          auVar110 = *(undefined1 (*) [16])(lVar10 + uVar88 * 4);
          auVar111 = vunpcklps_avx(auVar95,auVar110);
          auVar126 = vunpckhps_avx(auVar95,auVar110);
          auVar95 = *(undefined1 (*) [16])(lVar9 + uVar79 * 4);
          auVar110 = *(undefined1 (*) [16])(lVar11 + uVar84 * 4);
          auVar138 = vunpcklps_avx(auVar95,auVar110);
          auVar95 = vunpckhps_avx(auVar95,auVar110);
          auVar47 = vunpcklps_avx(auVar126,auVar95);
          auVar93 = vunpcklps_avx(auVar111,auVar138);
          auVar126 = vunpckhps_avx(auVar111,auVar138);
          auVar95 = vshufps_avx(local_1330,local_1330,0);
          auVar110 = ZEXT416((uint)(1.0 - fVar92));
          auVar110 = vshufps_avx(auVar110,auVar110,0);
          fVar92 = auVar95._0_4_;
          fVar104 = auVar95._4_4_;
          fVar105 = auVar95._8_4_;
          fVar106 = auVar95._12_4_;
          fVar107 = auVar110._0_4_;
          fVar108 = auVar110._4_4_;
          fVar109 = auVar110._8_4_;
          fVar118 = auVar110._12_4_;
          auVar141._4_4_ = fVar108 * (float)local_1390._4_4_ + auVar134._4_4_ * fVar104;
          auVar141._0_4_ = fVar107 * (float)local_1390._0_4_ + auVar134._0_4_ * fVar92;
          auVar141._8_4_ = fVar109 * fStack_1388 + auVar134._8_4_ * fVar105;
          auVar141._12_4_ = fVar118 * fStack_1384 + auVar134._12_4_ * fVar106;
          auVar149._4_4_ = fVar108 * (float)local_1370._4_4_ + fVar104 * auVar94._4_4_;
          auVar149._0_4_ = fVar107 * (float)local_1370._0_4_ + fVar92 * auVar94._0_4_;
          auVar149._8_4_ = fVar109 * fStack_1368 + fVar105 * auVar94._8_4_;
          auVar149._12_4_ = fVar118 * fStack_1364 + fVar106 * auVar94._12_4_;
          auVar180._4_4_ = fVar108 * (float)local_1350._4_4_ + auVar133._4_4_ * fVar104;
          auVar180._0_4_ = fVar107 * (float)local_1350._0_4_ + auVar133._0_4_ * fVar92;
          auVar180._8_4_ = fVar109 * fStack_1348 + auVar133._8_4_ * fVar105;
          auVar180._12_4_ = fVar118 * fStack_1344 + auVar133._12_4_ * fVar106;
          auVar142._0_4_ = fVar107 * (float)local_1380._0_4_ + fVar92 * auVar137._0_4_;
          auVar142._4_4_ = fVar108 * (float)local_1380._4_4_ + fVar104 * auVar137._4_4_;
          auVar142._8_4_ = fVar109 * fStack_1378 + fVar105 * auVar137._8_4_;
          auVar142._12_4_ = fVar118 * fStack_1374 + fVar106 * auVar137._12_4_;
          auVar120._0_4_ = fVar107 * (float)local_1360._0_4_ + auVar148._0_4_ * fVar92;
          auVar120._4_4_ = fVar108 * (float)local_1360._4_4_ + auVar148._4_4_ * fVar104;
          auVar120._8_4_ = fVar109 * fStack_1358 + auVar148._8_4_ * fVar105;
          auVar120._12_4_ = fVar118 * fStack_1354 + auVar148._12_4_ * fVar106;
          auVar199._0_4_ = fVar107 * (float)local_1340._0_4_ + auVar136._0_4_ * fVar92;
          auVar199._4_4_ = fVar108 * (float)local_1340._4_4_ + auVar136._4_4_ * fVar104;
          auVar199._8_4_ = fVar109 * fStack_1338 + auVar136._8_4_ * fVar105;
          auVar199._12_4_ = fVar118 * fStack_1334 + auVar136._12_4_ * fVar106;
          auVar141._20_4_ = fVar108 * (float)local_13c0._4_4_ + fVar104 * auVar127._4_4_;
          auVar141._16_4_ = fVar107 * (float)local_13c0._0_4_ + fVar92 * auVar127._0_4_;
          auVar141._24_4_ = fVar109 * fStack_13b8 + fVar105 * auVar127._8_4_;
          auVar141._28_4_ = fVar118 * fStack_13b4 + fVar106 * auVar127._12_4_;
          auVar149._20_4_ = fVar108 * (float)local_13b0._4_4_ + auVar125._4_4_ * fVar104;
          auVar149._16_4_ = fVar107 * (float)local_13b0._0_4_ + auVar125._0_4_ * fVar92;
          auVar149._24_4_ = fVar109 * fStack_13a8 + auVar125._8_4_ * fVar105;
          auVar149._28_4_ = fVar118 * fStack_13a4 + auVar125._12_4_ * fVar106;
          local_15a0 = auVar130._0_4_;
          fStack_159c = auVar130._4_4_;
          fStack_1598 = auVar130._8_4_;
          fStack_1594 = auVar130._12_4_;
          auVar180._20_4_ = fVar108 * fStack_159c + auVar119._4_4_ * fVar104;
          auVar180._16_4_ = fVar107 * local_15a0 + auVar119._0_4_ * fVar92;
          auVar180._24_4_ = fVar109 * fStack_1598 + auVar119._8_4_ * fVar105;
          fVar163 = fVar118 * fStack_1594 + auVar119._12_4_ * fVar106;
          auVar180._28_4_ = fVar163;
          lVar9 = uVar70 + 0x40 + lVar65;
          local_10e0 = *(undefined8 *)(lVar9 + 0x10);
          uStack_10d8 = *(undefined8 *)(lVar9 + 0x18);
          auVar135._0_4_ = auVar132._0_4_ * fVar107 + fVar92 * auVar93._0_4_;
          auVar135._4_4_ = auVar132._4_4_ * fVar108 + fVar104 * auVar93._4_4_;
          auVar135._8_4_ = auVar132._8_4_ * fVar109 + fVar105 * auVar93._8_4_;
          auVar135._12_4_ = auVar132._12_4_ * fVar118 + fVar106 * auVar93._12_4_;
          uStack_10d0 = local_10e0;
          uStack_10c8 = uStack_10d8;
          lVar65 = uVar70 + 0x50 + lVar65;
          local_1320 = *(undefined8 *)(lVar65 + 0x10);
          uStack_1318 = *(undefined8 *)(lVar65 + 0x18);
          auVar139._0_4_ = fVar107 * (float)local_13a0._0_4_ + fVar92 * auVar126._0_4_;
          auVar139._4_4_ = fVar108 * (float)local_13a0._4_4_ + fVar104 * auVar126._4_4_;
          auVar139._8_4_ = fVar109 * fStack_1398 + fVar105 * auVar126._8_4_;
          auVar139._12_4_ = fVar118 * fStack_1394 + fVar106 * auVar126._12_4_;
          local_15b0 = auVar131._0_4_;
          fStack_15ac = auVar131._4_4_;
          fStack_15a8 = auVar131._8_4_;
          fStack_15a4 = auVar131._12_4_;
          auVar93._0_4_ = fVar107 * local_15b0 + fVar92 * auVar47._0_4_;
          auVar93._4_4_ = fVar108 * fStack_15ac + fVar104 * auVar47._4_4_;
          auVar93._8_4_ = fVar109 * fStack_15a8 + fVar105 * auVar47._8_4_;
          auVar93._12_4_ = fVar118 * fStack_15a4 + fVar106 * auVar47._12_4_;
          uStack_1310 = local_1320;
          uStack_1308 = uStack_1318;
          auVar113._16_16_ = auVar142;
          auVar113._0_16_ = auVar142;
          auVar121._16_16_ = auVar120;
          auVar121._0_16_ = auVar120;
          auVar143._16_16_ = auVar199;
          auVar143._0_16_ = auVar199;
          auVar158._16_16_ = auVar135;
          auVar158._0_16_ = auVar135;
          auVar140._16_16_ = auVar139;
          auVar140._0_16_ = auVar139;
          auVar96._16_16_ = auVar93;
          auVar96._0_16_ = auVar93;
          auVar112 = vsubps_avx(auVar141,auVar113);
          auVar128 = vsubps_avx(auVar149,auVar121);
          auVar45 = vsubps_avx(auVar180,auVar143);
          auVar98 = vsubps_avx(auVar158,auVar141);
          auVar113 = vsubps_avx(auVar140,auVar149);
          auVar96 = vsubps_avx(auVar96,auVar180);
          fVar106 = auVar128._0_4_;
          fVar181 = auVar96._0_4_;
          fVar146 = auVar128._4_4_;
          fVar182 = auVar96._4_4_;
          auVar46._4_4_ = fVar182 * fVar146;
          auVar46._0_4_ = fVar181 * fVar106;
          fVar15 = auVar128._8_4_;
          fVar183 = auVar96._8_4_;
          auVar46._8_4_ = fVar183 * fVar15;
          fVar21 = auVar128._12_4_;
          fVar185 = auVar96._12_4_;
          auVar46._12_4_ = fVar185 * fVar21;
          fVar27 = auVar128._16_4_;
          fVar187 = auVar96._16_4_;
          auVar46._16_4_ = fVar187 * fVar27;
          fVar33 = auVar128._20_4_;
          fVar188 = auVar96._20_4_;
          auVar46._20_4_ = fVar188 * fVar33;
          fVar39 = auVar128._24_4_;
          fVar189 = auVar96._24_4_;
          auVar46._24_4_ = fVar189 * fVar39;
          auVar46._28_4_ = auVar93._12_4_;
          fVar107 = auVar45._0_4_;
          fVar173 = auVar113._0_4_;
          fVar184 = auVar45._4_4_;
          fVar174 = auVar113._4_4_;
          auVar48._4_4_ = fVar174 * fVar184;
          auVar48._0_4_ = fVar173 * fVar107;
          fVar16 = auVar45._8_4_;
          fVar175 = auVar113._8_4_;
          auVar48._8_4_ = fVar175 * fVar16;
          fVar22 = auVar45._12_4_;
          fVar176 = auVar113._12_4_;
          auVar48._12_4_ = fVar176 * fVar22;
          fVar28 = auVar45._16_4_;
          fVar177 = auVar113._16_4_;
          auVar48._16_4_ = fVar177 * fVar28;
          fVar34 = auVar45._20_4_;
          fVar178 = auVar113._20_4_;
          auVar48._20_4_ = fVar178 * fVar34;
          fVar40 = auVar45._24_4_;
          fVar179 = auVar113._24_4_;
          auVar48._24_4_ = fVar179 * fVar40;
          auVar48._28_4_ = auVar142._12_4_;
          local_1280 = vsubps_avx(auVar48,auVar46);
          fVar157 = auVar98._0_4_;
          fVar160 = auVar98._4_4_;
          auVar45._4_4_ = fVar160 * fVar184;
          auVar45._0_4_ = fVar157 * fVar107;
          fVar161 = auVar98._8_4_;
          auVar45._8_4_ = fVar161 * fVar16;
          fVar164 = auVar98._12_4_;
          auVar45._12_4_ = fVar164 * fVar22;
          fVar166 = auVar98._16_4_;
          auVar45._16_4_ = fVar166 * fVar28;
          fVar168 = auVar98._20_4_;
          auVar45._20_4_ = fVar168 * fVar34;
          fVar170 = auVar98._24_4_;
          auVar45._24_4_ = fVar170 * fVar40;
          auVar45._28_4_ = auVar142._12_4_;
          fVar190 = auVar112._0_4_;
          fVar193 = auVar112._4_4_;
          auVar49._4_4_ = fVar193 * fVar182;
          auVar49._0_4_ = fVar190 * fVar181;
          fVar194 = auVar112._8_4_;
          auVar49._8_4_ = fVar194 * fVar183;
          fVar195 = auVar112._12_4_;
          auVar49._12_4_ = fVar195 * fVar185;
          fVar196 = auVar112._16_4_;
          auVar49._16_4_ = fVar196 * fVar187;
          fVar197 = auVar112._20_4_;
          auVar49._20_4_ = fVar197 * fVar188;
          fVar198 = auVar112._24_4_;
          auVar49._24_4_ = fVar198 * fVar189;
          auVar49._28_4_ = auVar120._12_4_;
          auVar112 = vsubps_avx(auVar49,auVar45);
          auVar50._4_4_ = fVar193 * fVar174;
          auVar50._0_4_ = fVar190 * fVar173;
          auVar50._8_4_ = fVar194 * fVar175;
          auVar50._12_4_ = fVar195 * fVar176;
          auVar50._16_4_ = fVar196 * fVar177;
          auVar50._20_4_ = fVar197 * fVar178;
          auVar50._24_4_ = fVar198 * fVar179;
          auVar50._28_4_ = auVar120._12_4_;
          auVar51._4_4_ = fVar160 * fVar146;
          auVar51._0_4_ = fVar157 * fVar106;
          auVar51._8_4_ = fVar161 * fVar15;
          auVar51._12_4_ = fVar164 * fVar21;
          auVar51._16_4_ = fVar166 * fVar27;
          auVar51._20_4_ = fVar168 * fVar33;
          auVar51._24_4_ = fVar170 * fVar39;
          auVar51._28_4_ = auVar139._12_4_;
          uVar3 = *(undefined4 *)(ray + k * 4);
          auVar191._4_4_ = uVar3;
          auVar191._0_4_ = uVar3;
          auVar191._8_4_ = uVar3;
          auVar191._12_4_ = uVar3;
          auVar191._16_4_ = uVar3;
          auVar191._20_4_ = uVar3;
          auVar191._24_4_ = uVar3;
          auVar191._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar200._4_4_ = uVar3;
          auVar200._0_4_ = uVar3;
          auVar200._8_4_ = uVar3;
          auVar200._12_4_ = uVar3;
          auVar200._16_4_ = uVar3;
          auVar200._20_4_ = uVar3;
          auVar200._24_4_ = uVar3;
          auVar200._28_4_ = uVar3;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar201._4_4_ = uVar5;
          auVar201._0_4_ = uVar5;
          auVar201._8_4_ = uVar5;
          auVar201._12_4_ = uVar5;
          auVar201._16_4_ = uVar5;
          auVar201._20_4_ = uVar5;
          auVar201._24_4_ = uVar5;
          auVar201._28_4_ = uVar5;
          fVar92 = *(float *)(ray + k * 4 + 0xa0);
          local_1240 = vsubps_avx(auVar51,auVar50);
          local_14a0 = vsubps_avx(auVar141,auVar191);
          fVar104 = *(float *)(ray + k * 4 + 0xc0);
          auVar128 = vsubps_avx(auVar149,auVar200);
          auVar45 = vsubps_avx(auVar180,auVar201);
          fVar147 = auVar45._0_4_;
          fVar151 = auVar45._4_4_;
          auVar52._4_4_ = fVar151 * fVar92;
          auVar52._0_4_ = fVar147 * fVar92;
          fVar152 = auVar45._8_4_;
          auVar52._8_4_ = fVar152 * fVar92;
          fVar153 = auVar45._12_4_;
          auVar52._12_4_ = fVar153 * fVar92;
          fVar154 = auVar45._16_4_;
          auVar52._16_4_ = fVar154 * fVar92;
          fVar155 = auVar45._20_4_;
          auVar52._20_4_ = fVar155 * fVar92;
          fVar156 = auVar45._24_4_;
          auVar52._24_4_ = fVar156 * fVar92;
          auVar52._28_4_ = fVar163;
          fVar108 = auVar128._0_4_;
          fVar186 = auVar128._4_4_;
          auVar53._4_4_ = fVar104 * fVar186;
          auVar53._0_4_ = fVar104 * fVar108;
          fVar17 = auVar128._8_4_;
          auVar53._8_4_ = fVar104 * fVar17;
          fVar23 = auVar128._12_4_;
          auVar53._12_4_ = fVar104 * fVar23;
          fVar29 = auVar128._16_4_;
          auVar53._16_4_ = fVar104 * fVar29;
          fVar35 = auVar128._20_4_;
          auVar53._20_4_ = fVar104 * fVar35;
          fVar41 = auVar128._24_4_;
          auVar53._24_4_ = fVar104 * fVar41;
          auVar53._28_4_ = uVar3;
          auVar128 = vsubps_avx(auVar53,auVar52);
          fVar105 = *(float *)(ray + k * 4 + 0x80);
          fVar109 = local_14a0._0_4_;
          fVar4 = local_14a0._4_4_;
          auVar54._4_4_ = fVar104 * fVar4;
          auVar54._0_4_ = fVar104 * fVar109;
          fVar18 = local_14a0._8_4_;
          auVar54._8_4_ = fVar104 * fVar18;
          fVar24 = local_14a0._12_4_;
          auVar54._12_4_ = fVar104 * fVar24;
          fVar30 = local_14a0._16_4_;
          auVar54._16_4_ = fVar104 * fVar30;
          fVar36 = local_14a0._20_4_;
          auVar54._20_4_ = fVar104 * fVar36;
          fVar42 = local_14a0._24_4_;
          auVar54._24_4_ = fVar104 * fVar42;
          auVar54._28_4_ = uVar5;
          auVar55._4_4_ = fVar151 * fVar105;
          auVar55._0_4_ = fVar147 * fVar105;
          auVar55._8_4_ = fVar152 * fVar105;
          auVar55._12_4_ = fVar153 * fVar105;
          auVar55._16_4_ = fVar154 * fVar105;
          auVar55._20_4_ = fVar155 * fVar105;
          auVar55._24_4_ = fVar156 * fVar105;
          auVar55._28_4_ = auVar142._12_4_;
          auVar45 = vsubps_avx(auVar55,auVar54);
          auVar56._4_4_ = fVar105 * fVar186;
          auVar56._0_4_ = fVar105 * fVar108;
          auVar56._8_4_ = fVar105 * fVar17;
          auVar56._12_4_ = fVar105 * fVar23;
          auVar56._16_4_ = fVar105 * fVar29;
          auVar56._20_4_ = fVar105 * fVar35;
          auVar56._24_4_ = fVar105 * fVar41;
          auVar56._28_4_ = uVar5;
          auVar57._4_4_ = fVar4 * fVar92;
          auVar57._0_4_ = fVar109 * fVar92;
          auVar57._8_4_ = fVar18 * fVar92;
          auVar57._12_4_ = fVar24 * fVar92;
          auVar57._16_4_ = fVar30 * fVar92;
          auVar57._20_4_ = fVar36 * fVar92;
          auVar57._24_4_ = fVar42 * fVar92;
          auVar57._28_4_ = local_14a0._28_4_;
          auVar46 = vsubps_avx(auVar57,auVar56);
          local_1480._0_4_ = auVar112._0_4_;
          local_1480._4_4_ = auVar112._4_4_;
          fStack_1478 = auVar112._8_4_;
          fStack_1474 = auVar112._12_4_;
          fStack_1470 = auVar112._16_4_;
          fStack_146c = auVar112._20_4_;
          fStack_1468 = auVar112._24_4_;
          uStack_1464 = auVar112._28_4_;
          fVar118 = local_1240._0_4_;
          fVar13 = local_1240._4_4_;
          fVar19 = local_1240._8_4_;
          fVar25 = local_1240._12_4_;
          fVar31 = local_1240._16_4_;
          fVar37 = local_1240._20_4_;
          fVar43 = local_1240._24_4_;
          fVar163 = local_1280._0_4_;
          fVar14 = local_1280._4_4_;
          fVar20 = local_1280._8_4_;
          fVar26 = local_1280._12_4_;
          fVar32 = local_1280._16_4_;
          fVar38 = local_1280._20_4_;
          fVar44 = local_1280._24_4_;
          auVar97._0_4_ = fVar105 * fVar163 + fVar104 * fVar118 + (float)local_1480._0_4_ * fVar92;
          auVar97._4_4_ = fVar105 * fVar14 + fVar104 * fVar13 + (float)local_1480._4_4_ * fVar92;
          auVar97._8_4_ = fVar105 * fVar20 + fVar104 * fVar19 + fStack_1478 * fVar92;
          auVar97._12_4_ = fVar105 * fVar26 + fVar104 * fVar25 + fStack_1474 * fVar92;
          auVar97._16_4_ = fVar105 * fVar32 + fVar104 * fVar31 + fStack_1470 * fVar92;
          auVar97._20_4_ = fVar105 * fVar38 + fVar104 * fVar37 + fStack_146c * fVar92;
          auVar97._24_4_ = fVar105 * fVar44 + fVar104 * fVar43 + fStack_1468 * fVar92;
          auVar97._28_4_ = fVar104 + fVar104 + fVar92;
          auVar122._8_4_ = 0x80000000;
          auVar122._0_8_ = 0x8000000080000000;
          auVar122._12_4_ = 0x80000000;
          auVar122._16_4_ = 0x80000000;
          auVar122._20_4_ = 0x80000000;
          auVar122._24_4_ = 0x80000000;
          auVar122._28_4_ = 0x80000000;
          auVar112 = vandps_avx(auVar97,auVar122);
          uVar69 = auVar112._0_4_;
          auVar129._0_4_ =
               (float)(uVar69 ^ (uint)(fVar157 * auVar128._0_4_ +
                                      fVar181 * auVar46._0_4_ + fVar173 * auVar45._0_4_));
          uVar63 = auVar112._4_4_;
          auVar129._4_4_ =
               (float)(uVar63 ^ (uint)(fVar160 * auVar128._4_4_ +
                                      fVar182 * auVar46._4_4_ + fVar174 * auVar45._4_4_));
          uVar162 = auVar112._8_4_;
          auVar129._8_4_ =
               (float)(uVar162 ^
                      (uint)(fVar161 * auVar128._8_4_ +
                            fVar183 * auVar46._8_4_ + fVar175 * auVar45._8_4_));
          uVar165 = auVar112._12_4_;
          auVar129._12_4_ =
               (float)(uVar165 ^
                      (uint)(fVar164 * auVar128._12_4_ +
                            fVar185 * auVar46._12_4_ + fVar176 * auVar45._12_4_));
          uVar167 = auVar112._16_4_;
          auVar129._16_4_ =
               (float)(uVar167 ^
                      (uint)(fVar166 * auVar128._16_4_ +
                            fVar187 * auVar46._16_4_ + fVar177 * auVar45._16_4_));
          uVar169 = auVar112._20_4_;
          auVar129._20_4_ =
               (float)(uVar169 ^
                      (uint)(fVar168 * auVar128._20_4_ +
                            fVar188 * auVar46._20_4_ + fVar178 * auVar45._20_4_));
          uVar171 = auVar112._24_4_;
          auVar129._24_4_ =
               (float)(uVar171 ^
                      (uint)(fVar170 * auVar128._24_4_ +
                            fVar189 * auVar46._24_4_ + fVar179 * auVar45._24_4_));
          uVar172 = auVar112._28_4_;
          auVar129._28_4_ =
               (float)(uVar172 ^ (uint)(auVar98._28_4_ + auVar96._28_4_ + auVar113._28_4_));
          local_12e0._0_4_ =
               (float)(uVar69 ^ (uint)(auVar128._0_4_ * fVar190 +
                                      fVar107 * auVar46._0_4_ + fVar106 * auVar45._0_4_));
          local_12e0._4_4_ =
               (float)(uVar63 ^ (uint)(auVar128._4_4_ * fVar193 +
                                      fVar184 * auVar46._4_4_ + fVar146 * auVar45._4_4_));
          local_12e0._8_4_ =
               (float)(uVar162 ^
                      (uint)(auVar128._8_4_ * fVar194 +
                            fVar16 * auVar46._8_4_ + fVar15 * auVar45._8_4_));
          local_12e0._12_4_ =
               (float)(uVar165 ^
                      (uint)(auVar128._12_4_ * fVar195 +
                            fVar22 * auVar46._12_4_ + fVar21 * auVar45._12_4_));
          local_12e0._16_4_ =
               (float)(uVar167 ^
                      (uint)(auVar128._16_4_ * fVar196 +
                            fVar28 * auVar46._16_4_ + fVar27 * auVar45._16_4_));
          local_12e0._20_4_ =
               (float)(uVar169 ^
                      (uint)(auVar128._20_4_ * fVar197 +
                            fVar34 * auVar46._20_4_ + fVar33 * auVar45._20_4_));
          local_12e0._24_4_ =
               (float)(uVar171 ^
                      (uint)(auVar128._24_4_ * fVar198 +
                            fVar40 * auVar46._24_4_ + fVar39 * auVar45._24_4_));
          local_12e0._28_4_ = (float)(uVar172 ^ (uint)(auVar46._28_4_ + auVar45._28_4_ + -0.0));
          auVar128 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar112 = vcmpps_avx(auVar129,auVar128,5);
          auVar128 = vcmpps_avx(local_12e0,auVar128,5);
          auVar112 = vandps_avx(auVar112,auVar128);
          auVar123._8_4_ = 0x7fffffff;
          auVar123._0_8_ = 0x7fffffff7fffffff;
          auVar123._12_4_ = 0x7fffffff;
          auVar123._16_4_ = 0x7fffffff;
          auVar123._20_4_ = 0x7fffffff;
          auVar123._24_4_ = 0x7fffffff;
          auVar123._28_4_ = 0x7fffffff;
          local_12a0 = vandps_avx(auVar97,auVar123);
          auVar128 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar97,4);
          auVar112 = vandps_avx(auVar112,auVar128);
          auVar98._0_4_ = auVar129._0_4_ + local_12e0._0_4_;
          auVar98._4_4_ = auVar129._4_4_ + local_12e0._4_4_;
          auVar98._8_4_ = auVar129._8_4_ + local_12e0._8_4_;
          auVar98._12_4_ = auVar129._12_4_ + local_12e0._12_4_;
          auVar98._16_4_ = auVar129._16_4_ + local_12e0._16_4_;
          auVar98._20_4_ = auVar129._20_4_ + local_12e0._20_4_;
          auVar98._24_4_ = auVar129._24_4_ + local_12e0._24_4_;
          auVar98._28_4_ = auVar129._28_4_ + local_12e0._28_4_;
          auVar128 = vcmpps_avx(auVar98,local_12a0,2);
          auVar45 = auVar128 & auVar112;
          if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar45 >> 0x7f,0) != '\0') ||
                (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar45 >> 0xbf,0) != '\0') ||
              (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar45[0x1f] < '\0') {
            auVar112 = vandps_avx(auVar112,auVar128);
            auVar95 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
            local_12c0._0_4_ =
                 (float)(uVar69 ^ (uint)(fVar163 * fVar109 +
                                        (float)local_1480._0_4_ * fVar108 + fVar147 * fVar118));
            local_12c0._4_4_ =
                 (float)(uVar63 ^ (uint)(fVar14 * fVar4 +
                                        (float)local_1480._4_4_ * fVar186 + fVar151 * fVar13));
            local_12c0._8_4_ =
                 (float)(uVar162 ^ (uint)(fVar20 * fVar18 + fStack_1478 * fVar17 + fVar152 * fVar19)
                        );
            local_12c0._12_4_ =
                 (float)(uVar165 ^ (uint)(fVar26 * fVar24 + fStack_1474 * fVar23 + fVar153 * fVar25)
                        );
            local_12c0._16_4_ =
                 (float)(uVar167 ^ (uint)(fVar32 * fVar30 + fStack_1470 * fVar29 + fVar154 * fVar31)
                        );
            local_12c0._20_4_ =
                 (float)(uVar169 ^ (uint)(fVar38 * fVar36 + fStack_146c * fVar35 + fVar155 * fVar37)
                        );
            local_12c0._24_4_ =
                 (float)(uVar171 ^ (uint)(fVar44 * fVar42 + fStack_1468 * fVar41 + fVar156 * fVar43)
                        );
            local_12c0._28_4_ = uVar172 ^ 0x7fc00000;
            fVar92 = *(float *)(ray + k * 4 + 0x60);
            fVar104 = local_12a0._0_4_;
            fVar105 = local_12a0._4_4_;
            auVar58._4_4_ = fVar105 * fVar92;
            auVar58._0_4_ = fVar104 * fVar92;
            fVar106 = local_12a0._8_4_;
            auVar58._8_4_ = fVar106 * fVar92;
            fVar107 = local_12a0._12_4_;
            auVar58._12_4_ = fVar107 * fVar92;
            fVar108 = local_12a0._16_4_;
            auVar58._16_4_ = fVar108 * fVar92;
            fVar109 = local_12a0._20_4_;
            auVar58._20_4_ = fVar109 * fVar92;
            fVar146 = local_12a0._24_4_;
            auVar58._24_4_ = fVar146 * fVar92;
            auVar58._28_4_ = fVar92;
            auVar112 = vcmpps_avx(auVar58,local_12c0,1);
            fVar92 = *(float *)(ray + k * 4 + 0x100);
            auVar103 = ZEXT3264(CONCAT428(fVar92,CONCAT424(fVar92,CONCAT420(fVar92,CONCAT416(fVar92,
                                                  CONCAT412(fVar92,CONCAT48(fVar92,CONCAT44(fVar92,
                                                  fVar92))))))));
            auVar59._4_4_ = fVar92 * fVar105;
            auVar59._0_4_ = fVar92 * fVar104;
            auVar59._8_4_ = fVar92 * fVar106;
            auVar59._12_4_ = fVar92 * fVar107;
            auVar59._16_4_ = fVar92 * fVar108;
            auVar59._20_4_ = fVar92 * fVar109;
            auVar59._24_4_ = fVar92 * fVar146;
            auVar59._28_4_ = 0x7fffffff;
            auVar128 = vcmpps_avx(local_12c0,auVar59,2);
            auVar112 = vandps_avx(auVar112,auVar128);
            auVar110 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
            auVar95 = vpand_avx(auVar110,auVar95);
            auVar110 = vpmovzxwd_avx(auVar95);
            auVar148 = vpslld_avx(auVar110,0x1f);
            auVar94 = vpsrad_avx(auVar148,0x1f);
            auVar110 = vpunpckhwd_avx(auVar95,auVar95);
            auVar110 = vpslld_avx(auVar110,0x1f);
            auVar110 = vpsrad_avx(auVar110,0x1f);
            local_1460._16_16_ = auVar110;
            local_1460._0_16_ = auVar94;
            if ((((((((local_1460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1460 >> 0x7f,0) != '\0') ||
                  (local_1460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar110 >> 0x3f,0) != '\0') ||
                (local_1460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar110[0xf] < '\0') {
              local_1300 = auVar129;
              local_1260 = (float)local_1480._0_4_;
              fStack_125c = (float)local_1480._4_4_;
              fStack_1258 = fStack_1478;
              fStack_1254 = fStack_1474;
              fStack_1250 = fStack_1470;
              fStack_124c = fStack_146c;
              fStack_1248 = fStack_1468;
              uStack_1244 = uStack_1464;
              local_1220 = local_1460;
              local_1140 = local_1100;
              auVar128 = vrcpps_avx(local_12a0);
              fVar92 = auVar128._0_4_;
              auVar114._0_4_ = fVar104 * fVar92;
              fVar104 = auVar128._4_4_;
              auVar114._4_4_ = fVar105 * fVar104;
              fVar105 = auVar128._8_4_;
              auVar114._8_4_ = fVar106 * fVar105;
              fVar106 = auVar128._12_4_;
              auVar114._12_4_ = fVar107 * fVar106;
              fVar107 = auVar128._16_4_;
              auVar114._16_4_ = fVar108 * fVar107;
              fVar108 = auVar128._20_4_;
              auVar114._20_4_ = fVar109 * fVar108;
              fVar109 = auVar128._24_4_;
              auVar114._24_4_ = fVar146 * fVar109;
              auVar114._28_4_ = 0;
              auVar144._8_4_ = 0x3f800000;
              auVar144._0_8_ = 0x3f8000003f800000;
              auVar144._12_4_ = 0x3f800000;
              auVar144._16_4_ = 0x3f800000;
              auVar144._20_4_ = 0x3f800000;
              auVar144._24_4_ = 0x3f800000;
              auVar144._28_4_ = 0x3f800000;
              auVar45 = vsubps_avx(auVar144,auVar114);
              fVar92 = fVar92 + fVar92 * auVar45._0_4_;
              fVar104 = fVar104 + fVar104 * auVar45._4_4_;
              fVar105 = fVar105 + fVar105 * auVar45._8_4_;
              fVar106 = fVar106 + fVar106 * auVar45._12_4_;
              fVar107 = fVar107 + fVar107 * auVar45._16_4_;
              fVar108 = fVar108 + fVar108 * auVar45._20_4_;
              fVar109 = fVar109 + fVar109 * auVar45._24_4_;
              local_11c0._4_4_ = local_12c0._4_4_ * fVar104;
              local_11c0._0_4_ = local_12c0._0_4_ * fVar92;
              local_11c0._8_4_ = local_12c0._8_4_ * fVar105;
              local_11c0._12_4_ = local_12c0._12_4_ * fVar106;
              local_11c0._16_4_ = local_12c0._16_4_ * fVar107;
              local_11c0._20_4_ = local_12c0._20_4_ * fVar108;
              local_11c0._24_4_ = local_12c0._24_4_ * fVar109;
              local_11c0._28_4_ = local_12c0._28_4_;
              auVar145 = ZEXT3264(local_11c0);
              auVar60._4_4_ = fVar104 * auVar129._4_4_;
              auVar60._0_4_ = fVar92 * auVar129._0_4_;
              auVar60._8_4_ = fVar105 * auVar129._8_4_;
              auVar60._12_4_ = fVar106 * auVar129._12_4_;
              auVar60._16_4_ = fVar107 * auVar129._16_4_;
              auVar60._20_4_ = fVar108 * auVar129._20_4_;
              auVar60._24_4_ = fVar109 * auVar129._24_4_;
              auVar60._28_4_ = auVar45._28_4_;
              auVar112 = vminps_avx(auVar60,auVar144);
              auVar61._4_4_ = fVar104 * local_12e0._4_4_;
              auVar61._0_4_ = fVar92 * local_12e0._0_4_;
              auVar61._8_4_ = fVar105 * local_12e0._8_4_;
              auVar61._12_4_ = fVar106 * local_12e0._12_4_;
              auVar61._16_4_ = fVar107 * local_12e0._16_4_;
              auVar61._20_4_ = fVar108 * local_12e0._20_4_;
              auVar61._24_4_ = fVar109 * local_12e0._24_4_;
              auVar61._28_4_ = auVar128._28_4_ + auVar45._28_4_;
              auVar128 = vminps_avx(auVar61,auVar144);
              auVar45 = vsubps_avx(auVar144,auVar112);
              auVar98 = vsubps_avx(auVar144,auVar128);
              local_11e0 = vblendvps_avx(auVar128,auVar45,local_1100);
              local_1200 = vblendvps_avx(auVar112,auVar98,local_1100);
              local_11a0[0] = fVar163 * (float)local_1120._0_4_;
              local_11a0[1] = fVar14 * (float)local_1120._4_4_;
              local_11a0[2] = fVar20 * fStack_1118;
              local_11a0[3] = fVar26 * fStack_1114;
              fStack_1190 = fVar32 * fStack_1110;
              fStack_118c = fVar38 * fStack_110c;
              fStack_1188 = fVar44 * fStack_1108;
              uStack_1184 = local_1200._28_4_;
              local_1180[0] = (float)local_1480._0_4_ * (float)local_1120._0_4_;
              local_1180[1] = (float)local_1480._4_4_ * (float)local_1120._4_4_;
              local_1180[2] = fStack_1478 * fStack_1118;
              local_1180[3] = fStack_1474 * fStack_1114;
              fStack_1170 = fStack_1470 * fStack_1110;
              fStack_116c = fStack_146c * fStack_110c;
              fStack_1168 = fStack_1468 * fStack_1108;
              uStack_1164 = auVar112._28_4_;
              local_1160[0] = fVar118 * (float)local_1120._0_4_;
              local_1160[1] = fVar13 * (float)local_1120._4_4_;
              local_1160[2] = fVar19 * fStack_1118;
              local_1160[3] = fVar25 * fStack_1114;
              fStack_1150 = fVar31 * fStack_1110;
              fStack_114c = fVar37 * fStack_110c;
              fStack_1148 = fVar43 * fStack_1108;
              uStack_1144 = uStack_1104;
              auVar110 = vpunpckhwd_avx(auVar95,auVar95);
              auVar110 = vpslld_avx(auVar110,0x1f);
              auVar99._16_16_ = auVar110;
              auVar99._0_16_ = auVar148;
              auVar115._8_4_ = 0x7f800000;
              auVar115._0_8_ = 0x7f8000007f800000;
              auVar115._12_4_ = 0x7f800000;
              auVar115._16_4_ = 0x7f800000;
              auVar115._20_4_ = 0x7f800000;
              auVar115._24_4_ = 0x7f800000;
              auVar115._28_4_ = 0x7f800000;
              auVar112 = vblendvps_avx(auVar115,local_11c0,auVar99);
              auVar128 = vshufps_avx(auVar112,auVar112,0xb1);
              auVar128 = vminps_avx(auVar112,auVar128);
              auVar45 = vshufpd_avx(auVar128,auVar128,5);
              auVar128 = vminps_avx(auVar128,auVar45);
              auVar45 = vperm2f128_avx(auVar128,auVar128,1);
              auVar128 = vminps_avx(auVar128,auVar45);
              auVar112 = vcmpps_avx(auVar112,auVar128,0);
              auVar110 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
              auVar95 = vpand_avx(auVar110,auVar95);
              auVar110 = vpmovzxwd_avx(auVar95);
              auVar110 = vpslld_avx(auVar110,0x1f);
              auVar110 = vpsrad_avx(auVar110,0x1f);
              auVar95 = vpunpckhwd_avx(auVar95,auVar95);
              auVar95 = vpslld_avx(auVar95,0x1f);
              auVar95 = vpsrad_avx(auVar95,0x1f);
              auVar100._16_16_ = auVar95;
              auVar100._0_16_ = auVar110;
              if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar100 >> 0x7f,0) == '\0') &&
                    (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar95 >> 0x3f,0) == '\0') &&
                  (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar95[0xf]) {
                auVar100 = local_1460;
              }
              uVar63 = vmovmskps_avx(auVar100);
              uVar69 = 0;
              if (uVar63 != 0) {
                for (; (uVar63 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
                }
              }
LAB_003aa64a:
              uVar72 = (ulong)uVar69;
              uVar69 = *(uint *)((long)&local_10e0 + uVar72 * 4);
              pGVar8 = (pSVar6->geometries).items[uVar69].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1460 + uVar72 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar3 = *(undefined4 *)(local_1200 + uVar72 * 4);
                  uVar5 = *(undefined4 *)(local_11e0 + uVar72 * 4);
                  *(float *)(ray + k * 4 + 0x100) = local_11a0[uVar72 - 8];
                  *(float *)(ray + k * 4 + 0x180) = local_11a0[uVar72];
                  *(float *)(ray + k * 4 + 0x1a0) = local_1180[uVar72];
                  *(float *)(ray + k * 4 + 0x1c0) = local_1160[uVar72];
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_1320 + uVar72 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar69;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  goto LAB_003aa41b;
                }
                _local_1480 = auVar145._0_32_;
                uVar3 = *(undefined4 *)(local_1200 + uVar72 * 4);
                local_1060._4_4_ = uVar3;
                local_1060._0_4_ = uVar3;
                local_1060._8_4_ = uVar3;
                local_1060._12_4_ = uVar3;
                local_1060._16_4_ = uVar3;
                local_1060._20_4_ = uVar3;
                local_1060._24_4_ = uVar3;
                local_1060._28_4_ = uVar3;
                local_1040 = *(undefined4 *)(local_11e0 + uVar72 * 4);
                auStack_ff0 = vpshufd_avx(ZEXT416(uVar69),0);
                local_1020 = *(undefined4 *)((long)&local_1320 + uVar72 * 4);
                fVar92 = local_11a0[uVar72];
                fVar104 = local_1180[uVar72];
                local_10a0._4_4_ = fVar104;
                local_10a0._0_4_ = fVar104;
                local_10a0._8_4_ = fVar104;
                local_10a0._12_4_ = fVar104;
                local_10a0._16_4_ = fVar104;
                local_10a0._20_4_ = fVar104;
                local_10a0._24_4_ = fVar104;
                local_10a0._28_4_ = fVar104;
                fVar104 = local_1160[uVar72];
                local_1080._4_4_ = fVar104;
                local_1080._0_4_ = fVar104;
                local_1080._8_4_ = fVar104;
                local_1080._12_4_ = fVar104;
                local_1080._16_4_ = fVar104;
                local_1080._20_4_ = fVar104;
                local_1080._24_4_ = fVar104;
                local_1080._28_4_ = fVar104;
                local_10c0[0] = (RTCHitN)SUB41(fVar92,0);
                local_10c0[1] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_10c0[4] = (RTCHitN)SUB41(fVar92,0);
                local_10c0[5] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_10c0[8] = (RTCHitN)SUB41(fVar92,0);
                local_10c0[9] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_10c0[0xc] = (RTCHitN)SUB41(fVar92,0);
                local_10c0[0xd] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_10c0[0x10] = (RTCHitN)SUB41(fVar92,0);
                local_10c0[0x11] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_10c0[0x14] = (RTCHitN)SUB41(fVar92,0);
                local_10c0[0x15] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_10c0[0x18] = (RTCHitN)SUB41(fVar92,0);
                local_10c0[0x19] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)SUB41(fVar92,0);
                local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                uStack_101c = local_1020;
                uStack_1018 = local_1020;
                uStack_1014 = local_1020;
                uStack_1010 = local_1020;
                uStack_100c = local_1020;
                uStack_1008 = local_1020;
                uStack_1004 = local_1020;
                local_1000 = auStack_ff0;
                vcmpps_avx(local_1060,local_1060,0xf);
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                *(float *)(ray + k * 4 + 0x100) = local_11a0[uVar72 - 8];
                local_1500 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar71 & 0xf) << 4));
                local_14f0 = *(undefined1 (*) [16])
                              (mm_lookupmask_ps + (long)((int)uVar71 >> 4) * 0x10);
                local_14d0.valid = (int *)local_1500;
                local_14d0.geometryUserPtr = pGVar8->userPtr;
                local_14d0.context = context->user;
                local_14d0.hit = local_10c0;
                local_14d0.N = 8;
                local_14a0._0_8_ = pGVar8;
                local_14d0.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar8->intersectionFilterN)(&local_14d0);
                }
                auVar95 = vpcmpeqd_avx(local_1500,ZEXT816(0) << 0x40);
                auVar110 = vpcmpeqd_avx(local_14f0,ZEXT816(0) << 0x40);
                auVar124._16_16_ = auVar110;
                auVar124._0_16_ = auVar95;
                auVar112 = _DAT_01fe9960 & ~auVar124;
                if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar112 >> 0x7f,0) == '\0') &&
                      (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar112 >> 0xbf,0) == '\0') &&
                    (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar112[0x1f]) {
                  auVar101._0_8_ = auVar95._0_8_ ^ 0xffffffffffffffff;
                  auVar101._8_4_ = auVar95._8_4_ ^ 0xffffffff;
                  auVar101._12_4_ = auVar95._12_4_ ^ 0xffffffff;
                  auVar101._16_4_ = auVar110._0_4_ ^ 0xffffffff;
                  auVar101._20_4_ = auVar110._4_4_ ^ 0xffffffff;
                  auVar101._24_4_ = auVar110._8_4_ ^ 0xffffffff;
                  auVar101._28_4_ = auVar110._12_4_ ^ 0xffffffff;
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_14a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (*p_Var12)(&local_14d0);
                  }
                  auVar94 = ZEXT816(0) << 0x40;
                  auVar95 = vpcmpeqd_avx(local_1500,auVar94);
                  auVar110 = vpcmpeqd_avx(local_14f0,auVar94);
                  auVar117._16_16_ = auVar110;
                  auVar117._0_16_ = auVar95;
                  auVar112 = vcmpps_avx(ZEXT1632(auVar94),ZEXT1632(auVar94),0xf);
                  auVar101._0_4_ = auVar95._0_4_ ^ auVar112._0_4_;
                  auVar101._4_4_ = auVar95._4_4_ ^ auVar112._4_4_;
                  auVar101._8_4_ = auVar95._8_4_ ^ auVar112._8_4_;
                  auVar101._12_4_ = auVar95._12_4_ ^ auVar112._12_4_;
                  auVar101._16_4_ = auVar110._0_4_ ^ auVar112._16_4_;
                  auVar101._20_4_ = auVar110._4_4_ ^ auVar112._20_4_;
                  auVar101._24_4_ = auVar110._8_4_ ^ auVar112._24_4_;
                  auVar101._28_4_ = auVar110._12_4_ ^ auVar112._28_4_;
                  auVar112 = auVar112 & ~auVar117;
                  if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar112 >> 0x7f,0) != '\0') ||
                        (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar112 >> 0xbf,0) != '\0') ||
                      (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar112[0x1f] < '\0') {
                    auVar112 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])local_14d0.hit);
                    *(undefined1 (*) [32])(local_14d0.ray + 0x180) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])(local_14d0.hit + 0x20)
                                             );
                    *(undefined1 (*) [32])(local_14d0.ray + 0x1a0) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])(local_14d0.hit + 0x40)
                                             );
                    *(undefined1 (*) [32])(local_14d0.ray + 0x1c0) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])(local_14d0.hit + 0x60)
                                             );
                    *(undefined1 (*) [32])(local_14d0.ray + 0x1e0) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])(local_14d0.hit + 0x80)
                                             );
                    *(undefined1 (*) [32])(local_14d0.ray + 0x200) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])(local_14d0.hit + 0xa0)
                                             );
                    *(undefined1 (*) [32])(local_14d0.ray + 0x220) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])(local_14d0.hit + 0xc0)
                                             );
                    *(undefined1 (*) [32])(local_14d0.ray + 0x240) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])(local_14d0.hit + 0xe0)
                                             );
                    *(undefined1 (*) [32])(local_14d0.ray + 0x260) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])
                                                        (local_14d0.hit + 0x100));
                    *(undefined1 (*) [32])(local_14d0.ray + 0x280) = auVar112;
                  }
                }
                if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar101 >> 0x7f,0) == '\0') &&
                      (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar101 >> 0xbf,0) == '\0') &&
                    (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar101[0x1f]) {
                  local_15e0._0_4_ = auVar103._0_4_;
                  *(undefined4 *)(ray + k * 4 + 0x100) = local_15e0._0_4_;
                  local_15e0 = auVar103._0_32_;
                }
                else {
                  local_15e0 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_1460 + uVar72 * 4) = 0;
                auVar103 = ZEXT3264(local_15e0);
                auVar95 = vshufps_avx(local_15e0._0_16_,local_15e0._0_16_,0);
                auVar102._16_16_ = auVar95;
                auVar102._0_16_ = auVar95;
                auVar145 = ZEXT3264(_local_1480);
                auVar112 = vcmpps_avx(_local_1480,auVar102,2);
                local_1460 = vandps_avx(auVar112,local_1460);
              }
              if ((((((((local_1460 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1460 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1460 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1460 >> 0x7f,0) == '\0') &&
                    (local_1460 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1460 >> 0xbf,0) == '\0') &&
                  (local_1460 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1460[0x1f]) goto LAB_003aa41b;
              auVar116._8_4_ = 0x7f800000;
              auVar116._0_8_ = 0x7f8000007f800000;
              auVar116._12_4_ = 0x7f800000;
              auVar116._16_4_ = 0x7f800000;
              auVar116._20_4_ = 0x7f800000;
              auVar116._24_4_ = 0x7f800000;
              auVar116._28_4_ = 0x7f800000;
              auVar112 = vblendvps_avx(auVar116,auVar145._0_32_,local_1460);
              auVar128 = vshufps_avx(auVar112,auVar112,0xb1);
              auVar128 = vminps_avx(auVar112,auVar128);
              auVar45 = vshufpd_avx(auVar128,auVar128,5);
              auVar128 = vminps_avx(auVar128,auVar45);
              auVar45 = vperm2f128_avx(auVar128,auVar128,1);
              auVar128 = vminps_avx(auVar128,auVar45);
              auVar128 = vcmpps_avx(auVar112,auVar128,0);
              auVar45 = local_1460 & auVar128;
              auVar112 = local_1460;
              if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar45 >> 0x7f,0) != '\0') ||
                    (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar45 >> 0xbf,0) != '\0') ||
                  (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar45[0x1f] < '\0') {
                auVar112 = vandps_avx(auVar128,local_1460);
              }
              uVar63 = vmovmskps_avx(auVar112);
              uVar69 = 0;
              if (uVar63 != 0) {
                for (; (uVar63 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
                }
              }
              goto LAB_003aa64a;
            }
          }
LAB_003aa41b:
          lVar66 = lVar66 + 1;
        } while (lVar66 != uVar89 - 8);
      }
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar103 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
      auVar145 = ZEXT1664(local_13d0);
      auVar150 = ZEXT1664(local_13e0);
      auVar159 = ZEXT1664(local_13f0);
      auVar192 = ZEXT1664(local_1430);
      fVar92 = local_1400;
      fVar104 = fStack_13fc;
      fVar105 = fStack_13f8;
      fVar106 = fStack_13f4;
      fVar107 = local_1410;
      fVar108 = fStack_140c;
      fVar109 = fStack_1408;
      fVar118 = fStack_1404;
      fVar163 = local_1420;
      fVar146 = fStack_141c;
      fVar184 = fStack_1418;
      fVar186 = fStack_1414;
    }
    if (pauVar64 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }